

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

int read_fdesign_line(char **name,char **value)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int length;
  long lVar5;
  
  iVar3 = 0;
LAB_00198dab:
  do {
    length = iVar3;
    uVar2 = getc((FILE *)fin);
    if ((int)uVar2 < 0) {
      iVar3 = feof((FILE *)fin);
      if (iVar3 != 0) {
        return 0;
      }
    }
    else {
      iVar3 = 0;
      if (uVar2 == 10) goto LAB_00198dab;
    }
    iVar3 = isspace(uVar2 & 0xff);
    if (iVar3 == 0) {
      lVar4 = (long)length;
      length = length + 1;
      buffer[lVar4] = (char)uVar2;
      expand_buffer(length);
    }
    iVar3 = length;
  } while (uVar2 != 0x3a);
  lVar4 = (long)length;
  buffer[lVar4 + -1] = '\0';
  do {
    uVar2 = getc((FILE *)fin);
    lVar5 = lVar4;
    if ((int)uVar2 < 0) {
      iVar3 = feof((FILE *)fin);
      if (iVar3 != 0) break;
    }
    else if (uVar2 == 10) break;
    iVar3 = isspace(uVar2 & 0xff);
  } while (iVar3 != 0);
LAB_00198e56:
  pcVar1 = buffer;
  if (uVar2 == 0x5c) goto code_r0x00198e5b;
  if (uVar2 == 10) {
    buffer[(int)lVar5] = '\0';
    *name = pcVar1;
    *value = pcVar1 + lVar4;
    return 1;
  }
  goto LAB_00198e6d;
code_r0x00198e5b:
  uVar2 = read_quoted();
  if (-1 < (int)uVar2) {
LAB_00198e6d:
    buffer[lVar5] = (char)uVar2;
    expand_buffer((int)(lVar5 + 1));
    uVar2 = getc((FILE *)fin);
    lVar5 = lVar5 + 1;
  }
  goto LAB_00198e56;
}

Assistant:

int read_fdesign_line(const char*& name, const char*& value) {

  int length = 0;
  int x;
  // find a colon:
  for (;;) {
    x = getc(fin);
    if (x < 0 && feof(fin)) return 0;
    if (x == '\n') {length = 0; continue;} // no colon this line...
    if (!isspace(x & 255)) {
      buffer[length++] = x;
      expand_buffer(length);
    }
    if (x == ':') break;
  }
  int valueoffset = length;
  buffer[length-1] = 0;

  // skip to start of value:
  for (;;) {
    x = getc(fin);
    if ((x < 0 && feof(fin)) || x == '\n' || !isspace(x & 255)) break;
  }

  // read the value:
  for (;;) {
    if (x == '\\') {x = read_quoted(); if (x<0) continue;}
    else if (x == '\n') break;
    buffer[length++] = x;
    expand_buffer(length);
    x = getc(fin);
  }
  buffer[length] = 0;
  name = buffer;
  value = buffer+valueoffset;
  return 1;
}